

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

bool __thiscall QDockWidgetPrivate::mousePressEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  uint uVar5;
  QDockWidgetLayout *this_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar11 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  QPointF local_50;
  QPoint local_40;
  QPoint local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  bVar2 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar2) {
    local_38.xp.m_i = (this_00->_titleArea).x1.m_i;
    local_38.yp.m_i = (this_00->_titleArea).y1.m_i;
    uStack_30._0_4_ = (this_00->_titleArea).x2;
    uStack_30._4_4_ = (this_00->_titleArea).y2;
    lVar6 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    if (*(int *)(event + 0x40) == 1) {
      uVar4 = QEventPoint::position();
      auVar12._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar12._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar12 = minpd(_DAT_0066f5d0,auVar12);
      auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
      auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
      uVar5 = movmskpd(uVar4,auVar11);
      uVar10 = 0x8000000000000000;
      if ((uVar5 & 1) != 0) {
        uVar10 = (ulong)(uint)(int)auVar12._0_8_ << 0x20;
      }
      uVar7 = 0x80000000;
      if ((uVar5 & 2) != 0) {
        uVar7 = (ulong)(uint)(int)auVar12._8_8_;
      }
      local_50.xp = (qreal)(uVar7 | uVar10);
      cVar3 = QRect::contains(&local_38,SUB81(&local_50,0));
      if ((cVar3 != '\0') &&
         ((((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
            super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 2) != 0 ||
          ((*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) != 0)))) {
        lVar8 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
        if (lVar6 != 0 || lVar8 != 0) {
          bVar2 = isAnimating(this);
          if ((!bVar2) && (this->state == (DragState *)0x0)) {
            local_50 = (QPointF)QEventPoint::position();
            local_40 = QPointF::toPoint(&local_50);
            initDrag(this,&local_40,false);
            bVar2 = true;
            if (this->state != (DragState *)0x0) {
              uVar5 = (this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                      super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
              if (((uVar5 & 4) == 0) || (bVar9 = true, ((byte)event[0x23] & 4) == 0)) {
                if ((uVar5 & 2) == 0) {
                  bVar9 = (bool)(*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1);
                }
                else {
                  bVar9 = false;
                }
              }
              this->state->ctrlDrag = bVar9;
            }
            goto LAB_00407c46;
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_00407c46:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetPrivate::mousePressEvent(QMouseEvent *event)
{
#if QT_CONFIG(mainwindow)
    Q_Q(QDockWidget);

    QDockWidgetLayout *dwLayout
        = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);

        if (event->button() != Qt::LeftButton ||
            !titleArea.contains(event->position().toPoint()) ||
            // check if the tool window is movable... do nothing if it
            // is not (but allow moving if the window is floating)
            (!hasFeature(this, QDockWidget::DockWidgetMovable) && !q->isFloating()) ||
            (qobject_cast<QMainWindow*>(parent) == nullptr && !floatingTab) ||
            isAnimating() || state != nullptr) {
            return false;
        }

        initDrag(event->position().toPoint(), false);

        if (state)
            state->ctrlDrag = (hasFeature(this, QDockWidget::DockWidgetFloatable) && event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());

        return true;
    }

#endif // QT_CONFIG(mainwindow)
    return false;
}